

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Segment::AddFrameWithAdditional
          (Segment *this,uint8_t *data,uint64_t length,uint8_t *additional,
          uint64_t additional_length,uint64_t add_id,uint64_t track_number,uint64_t timestamp,
          bool is_key)

{
  bool bVar1;
  undefined1 local_b0 [8];
  Frame frame;
  bool is_key_local;
  uint64_t add_id_local;
  uint64_t additional_length_local;
  uint8_t *additional_local;
  uint64_t length_local;
  uint8_t *data_local;
  Segment *this_local;
  
  frame._103_1_ = is_key;
  if ((data == (uint8_t *)0x0) || (additional == (uint8_t *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    Frame::Frame((Frame *)local_b0);
    bVar1 = Frame::Init((Frame *)local_b0,data,length);
    if ((bVar1) &&
       (bVar1 = Frame::AddAdditionalData((Frame *)local_b0,additional,additional_length,add_id),
       bVar1)) {
      Frame::set_track_number((Frame *)local_b0,track_number);
      Frame::set_timestamp((Frame *)local_b0,timestamp);
      Frame::set_is_key((Frame *)local_b0,(bool)(frame._103_1_ & 1));
      this_local._7_1_ = AddGenericFrame(this,(Frame *)local_b0);
    }
    else {
      this_local._7_1_ = false;
    }
    Frame::~Frame((Frame *)local_b0);
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::AddFrameWithAdditional(const uint8_t* data, uint64_t length,
                                     const uint8_t* additional,
                                     uint64_t additional_length,
                                     uint64_t add_id, uint64_t track_number,
                                     uint64_t timestamp, bool is_key) {
  if (!data || !additional)
    return false;

  Frame frame;
  if (!frame.Init(data, length) ||
      !frame.AddAdditionalData(additional, additional_length, add_id)) {
    return false;
  }
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp);
  frame.set_is_key(is_key);
  return AddGenericFrame(&frame);
}